

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void kratos::CheckFlipFlopAlwaysFFVisitor::check_always_ff(SequentialStmtBlock *stmt)

{
  initializer_list<kratos::IRNode_*> __l;
  bool bVar1;
  StatementType SVar2;
  element_type *this;
  uint64_t uVar3;
  StmtException *this_00;
  allocator<kratos::IRNode_*> local_a1;
  SequentialStmtBlock *local_a0;
  SequentialStmtBlock **local_98;
  size_type local_90;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_88;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  shared_ptr<kratos::Stmt> s;
  uint64_t stmt_count;
  uint64_t i;
  bool has_if;
  SequentialStmtBlock *stmt_local;
  
  bVar1 = false;
  stmt_count = 0;
  s.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)StmtBlock::size(&stmt->super_StmtBlock);
  while (!bVar1 && stmt_count <
                   s.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  {
    StmtBlock::get_stmt((StmtBlock *)local_38,(uint64_t)stmt);
    this = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_38);
    SVar2 = Stmt::type(this);
    if (SVar2 == If) {
      bVar1 = true;
    }
    stmt_count = stmt_count + 1;
    std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)local_38);
  }
  if ((bVar1) && (uVar3 = StmtBlock::size(&stmt->super_StmtBlock), 1 < uVar3)) {
    this_00 = (StmtException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,anon_var_dwarf_615658,&local_59);
    local_98 = &local_a0;
    local_90 = 1;
    local_a0 = stmt;
    std::allocator<kratos::IRNode_*>::allocator(&local_a1);
    __l._M_len = local_90;
    __l._M_array = (iterator)local_98;
    std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
              (&local_88,__l,&local_a1);
    StmtException::StmtException(this_00,&local_58,&local_88);
    __cxa_throw(this_00,&StmtException::typeinfo,StmtException::~StmtException);
  }
  return;
}

Assistant:

void static check_always_ff(SequentialStmtBlock* stmt) {
        // first pass to determine if there is any if statement in top level
        bool has_if = false;
        uint64_t i = 0;
        uint64_t stmt_count = stmt->size();
        while ((!has_if) && (i < stmt_count)) {
            auto s = stmt->get_stmt(i);
            if (s->type() == StatementType::If) has_if = true;
            i++;
        }
        if (has_if && stmt->size() > 1) {
            // DC cannot infer as a D-flip-flop
            // error message copied from DC
            throw StmtException(
                "The statements in this 'always' block are outside the "
                "scope of the synthesis policy. Only an ’if’ statement "
                "is allowed at the top level in this ’always’ block. (ELAB-302)",
                {stmt});
        }
    }